

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O3

spv_target_env glslang::MapToSpirvToolsEnv(SpvVersion *spvVersion,SpvBuildLogger *logger)

{
  uint uVar1;
  spv_target_env sVar2;
  string local_38;
  
  switch(spvVersion->vulkan << 0x14 | spvVersion->vulkan - 0x400000U >> 0xc) {
  case 0:
    sVar2 = SPV_ENV_VULKAN_1_0;
    break;
  case 1:
    uVar1 = spvVersion->spv << 0x18 | spvVersion->spv - 0x10000 >> 8;
    if (uVar1 < 5) {
      sVar2 = *(spv_target_env *)(&DAT_00702b38 + (ulong)uVar1 * 4);
    }
    else {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Target version for SPIRV-Tools validator","");
      spv::SpvBuildLogger::missingFunctionality(logger,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      sVar2 = SPV_ENV_VULKAN_1_1;
    }
    break;
  case 2:
    sVar2 = SPV_ENV_VULKAN_1_2;
    break;
  case 3:
    sVar2 = SPV_ENV_VULKAN_1_3;
    break;
  case 4:
    sVar2 = SPV_ENV_VULKAN_1_4;
    break;
  default:
    sVar2 = SPV_ENV_OPENGL_4_5;
    if (spvVersion->openGl < 1) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Target version for SPIRV-Tools validator","");
      spv::SpvBuildLogger::missingFunctionality(logger,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      sVar2 = SPV_ENV_UNIVERSAL_1_0;
    }
  }
  return sVar2;
}

Assistant:

spv_target_env MapToSpirvToolsEnv(const SpvVersion& spvVersion, spv::SpvBuildLogger* logger)
{
    switch (spvVersion.vulkan) {
    case glslang::EShTargetVulkan_1_0:
        return spv_target_env::SPV_ENV_VULKAN_1_0;
    case glslang::EShTargetVulkan_1_1:
        switch (spvVersion.spv) {
        case EShTargetSpv_1_0:
        case EShTargetSpv_1_1:
        case EShTargetSpv_1_2:
        case EShTargetSpv_1_3:
            return spv_target_env::SPV_ENV_VULKAN_1_1;
        case EShTargetSpv_1_4:
            return spv_target_env::SPV_ENV_VULKAN_1_1_SPIRV_1_4;
        default:
            logger->missingFunctionality("Target version for SPIRV-Tools validator");
            return spv_target_env::SPV_ENV_VULKAN_1_1;
        }
    case glslang::EShTargetVulkan_1_2:
        return spv_target_env::SPV_ENV_VULKAN_1_2;
    case glslang::EShTargetVulkan_1_3:
        return spv_target_env::SPV_ENV_VULKAN_1_3;
    case glslang::EShTargetVulkan_1_4:
        return spv_target_env::SPV_ENV_VULKAN_1_4;
    default:
        break;
    }

    if (spvVersion.openGl > 0)
        return spv_target_env::SPV_ENV_OPENGL_4_5;

    logger->missingFunctionality("Target version for SPIRV-Tools validator");
    return spv_target_env::SPV_ENV_UNIVERSAL_1_0;
}